

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

const_iterator __thiscall
String::load(String *this,void *container_ptr,size_t element_count,InputStream *stream,
            const_iterator begin,const_iterator end)

{
  pointer puVar1;
  reference pvVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string *string_ptr;
  InputStream *stream_local;
  size_t element_count_local;
  void *container_ptr_local;
  String *this_local;
  const_iterator end_local;
  const_iterator begin_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)container_ptr;
  end_local = begin;
  std::__cxx11::string::clear();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,element_count);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  (**(code **)(*(long *)stream + 0x10))(stream,pvVar2,element_count);
  puVar1 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  std::__cxx11::string::append((char *)puVar1,(ulong)pvVar2);
  _Var3 = __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator+(&end_local,2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return (const_iterator)_Var3._M_current;
}

Assistant:

Container::MarshalOps::const_iterator String::load(
        void* container_ptr, size_t element_count,
        InputStream& stream,
        MarshalOps::const_iterator const begin, MarshalOps::const_iterator const end) const
{
    std::string* string_ptr =
        reinterpret_cast< std::string* >(container_ptr);

    string_ptr->clear();

    std::vector<uint8_t> buffer;
    buffer.resize(element_count);
    stream.read(&buffer[0], element_count);
    (*string_ptr).append(reinterpret_cast<const char*>(&buffer[0]), element_count);
    return begin + 2;
}